

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputICase3::Run(BasicInputICase3 *this)

{
  int *piVar1;
  long lVar2;
  Vector<int,_4> local_6c;
  Vector<int,_4> local_5c;
  Vector<int,_4> local_4c;
  Vector<int,_4> local_3c;
  Vector<int,_3> local_2c;
  Vector<int,_3> local_20;
  uint local_14;
  BasicInputICase3 *pBStack_10;
  GLuint i;
  BasicInputICase3 *this_local;
  
  pBStack_10 = this;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glVertexAttribI4i
              (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14,0,0,0,0);
    glu::CallLogWrapper::glVertexAttribI4ui
              (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14 + 8,0,0,0,0);
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x18,(void *)0x0,0x88e4);
  tcu::Vector<int,_3>::Vector(&local_20,1,2,3);
  piVar1 = tcu::Vector<int,_3>::operator[](&local_20,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0xc,piVar1);
  tcu::Vector<int,_3>::Vector(&local_2c,4,5,6);
  piVar1 = tcu::Vector<int,_3>::operator[](&local_2c,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xc,0xc,piVar1);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glVertexAttribIPointer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7,3,0x1404,0xc,(void *)0x0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glVertexAttribIFormat
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,2,0x1404,4);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,7);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputIBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7);
  tcu::Vector<int,_4>::Vector(&local_3c,2,3,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[0].m_data = local_3c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[0].m_data + 2) =
       local_3c.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_4c,1,2,3,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[7].m_data = local_4c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[7].m_data + 2) =
       local_4c.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_5c,5,6,0,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[8].m_data = local_5c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[8].m_data + 2) =
       local_5c.m_data._8_8_;
  tcu::Vector<int,_4>::Vector(&local_6c,4,5,6,1);
  *(undefined8 *)(this->super_BasicInputIBase).expected_datai[0xf].m_data = local_6c.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputIBase).expected_datai[0xf].m_data + 2) =
       local_6c.m_data._8_8_;
  lVar2 = BasicInputIBase::Run(&this->super_BasicInputIBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			glVertexAttribI4i(i, 0, 0, 0, 0);
			glVertexAttribI4ui(i + 8, 0, 0, 0, 0);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(IVec3) * 2, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(IVec3), &IVec3(1, 2, 3)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(IVec3), &IVec3(4, 5, 6)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glVertexAttribIPointer(7, 3, GL_INT, 12, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glVertexAttribIFormat(0, 2, GL_INT, 4);
		glVertexAttribBinding(0, 7);

		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(7);

		expected_datai[0]	 = IVec4(2, 3, 0, 1);
		expected_datai[7]	 = IVec4(1, 2, 3, 1);
		expected_datai[0 + 8] = IVec4(5, 6, 0, 1);
		expected_datai[7 + 8] = IVec4(4, 5, 6, 1);
		return BasicInputIBase::Run();
	}